

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Buffer::Free(Buffer *this,int BlockNum)

{
  list<int,_std::allocator<int>_> *plVar1;
  size_t *psVar2;
  int iVar3;
  _List_node_base *p_Var4;
  
  plVar1 = &this->Occupy_Block;
  p_Var4 = (_List_node_base *)plVar1;
  do {
    p_Var4 = (((_List_base<int,_std::allocator<int>_> *)&p_Var4->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)plVar1) break;
  } while (*(int *)&p_Var4[1]._M_next != BlockNum);
  if (p_Var4 != (_List_node_base *)plVar1) {
    iVar3 = *(int *)&p_Var4[1]._M_next;
    psVar2 = &(this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
              _M_size;
    *psVar2 = *psVar2 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var4,0x18);
    p_Var4 = (_List_node_base *)operator_new(0x18);
    *(int *)&p_Var4[1]._M_next = iVar3;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar2 = &(this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
              _M_size;
    *psVar2 = *psVar2 + 1;
    memset(this->buffer[iVar3].data,0,0x2000);
    Block::WriteFile(this->buffer + iVar3);
    std::__cxx11::string::_M_replace
              ((ulong)(this->buffer + iVar3),0,(char *)this->buffer[iVar3].FileName._M_string_length
               ,0x1493a5);
    this->buffer[iVar3].FileOff = -1;
    this->Dirty[iVar3] = 0;
    this->Pin[iVar3] = 0;
  }
  return;
}

Assistant:

void Buffer::Free(int BlockNum) {
	int pos;
	list<int>::iterator it;
	it = this->Find(BlockNum);
	if (it != this->Occupy_Block.end()) {			//B�ڱ�ռ��������
		pos = *it;
		it = this->Occupy_Block.erase(it);			//��ռ�ÿ�������ɾȥ
		this->Empty_Block.push_back(pos);			//��ӽ��տ�������
		this->buffer[pos].BlockClear_Back();
		this->UnDirt(pos);
		this->UnLock(pos);
	}
}